

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O1

void __thiscall spdlog::details::thread_pool::~thread_pool(thread_pool *this)

{
  pointer ptVar1;
  ulong uVar2;
  iterator __begin2;
  pointer ptVar3;
  async_msg aStack_1c8;
  
  ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar1 != ptVar3) {
    uVar2 = 0;
    do {
      memset(&aStack_1c8,0,0x180);
      aStack_1c8.super_log_msg_buffer.super_log_msg.level = off;
      aStack_1c8.super_log_msg_buffer.super_log_msg.time.__d.__r = (duration)0;
      aStack_1c8.super_log_msg_buffer.super_log_msg.thread_id = 0;
      aStack_1c8.super_log_msg_buffer.super_log_msg.color_range_start = 0;
      aStack_1c8.super_log_msg_buffer.super_log_msg.color_range_end._0_4_ = 0;
      aStack_1c8.super_log_msg_buffer.super_log_msg.color_range_end._4_4_ = 0;
      aStack_1c8.super_log_msg_buffer.super_log_msg.source.filename._0_4_ = 0;
      aStack_1c8.super_log_msg_buffer.super_log_msg.source._4_8_ = 0;
      aStack_1c8.super_log_msg_buffer.super_log_msg.source.funcname = (char *)0x0;
      aStack_1c8.super_log_msg_buffer.super_log_msg.payload.data_ = (char *)0x0;
      aStack_1c8.super_log_msg_buffer.super_log_msg.payload.size_ = 0;
      aStack_1c8.super_log_msg_buffer.buffer.super_buffer<char>.size_ = 0;
      aStack_1c8.super_log_msg_buffer.buffer.super_buffer<char>._vptr_buffer =
           (_func_int **)&PTR_grow_0032c4a0;
      aStack_1c8.super_log_msg_buffer.buffer.super_buffer<char>.ptr_ =
           aStack_1c8.super_log_msg_buffer.buffer.store_;
      aStack_1c8.super_log_msg_buffer.buffer.super_buffer<char>.capacity_ = 0xfa;
      aStack_1c8.msg_type = terminate;
      aStack_1c8.worker_ptr.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      aStack_1c8.worker_ptr.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      mpmc_blocking_queue<spdlog::details::async_msg>::enqueue(&this->q_,&aStack_1c8);
      async_msg::~async_msg(&aStack_1c8);
      uVar2 = uVar2 + 1;
      ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar2 < (ulong)((long)ptVar1 - (long)ptVar3 >> 3));
  }
  for (; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  std::vector<spdlog::details::async_msg,_std::allocator<spdlog::details::async_msg>_>::~vector
            (&(this->q_).q_.v_);
  std::condition_variable::~condition_variable(&(this->q_).pop_cv_);
  std::condition_variable::~condition_variable(&(this->q_).push_cv_);
  return;
}

Assistant:

SPDLOG_INLINE thread_pool::~thread_pool()
{
    SPDLOG_TRY
    {
        for (size_t i = 0; i < threads_.size(); i++)
        {
            post_async_msg_(async_msg(async_msg_type::terminate), async_overflow_policy::block);
        }

        for (auto &t : threads_)
        {
            t.join();
        }
    }
    SPDLOG_CATCH_ALL() {}
}

void SPDLOG_INLINE thread_pool::post_log(async_logger_ptr &&worker_ptr, const details::log_msg &msg, async_overflow_policy overflow_policy)
{
    async_msg async_m(std::move(worker_ptr), async_msg_type::log, msg);
    post_async_msg_(std::move(async_m), overflow_policy);
}